

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

void errmsg(char *m)

{
  size_t __n;
  ssize_t sVar1;
  char *in_RDI;
  ssize_t written;
  size_t s;
  size_t local_10;
  char *local_8;
  
  local_10 = strlen(in_RDI);
  local_8 = in_RDI;
  while( true ) {
    if (local_10 == 0) {
      return;
    }
    __n = strlen(local_8);
    sVar1 = write(2,local_8,__n);
    if (sVar1 < 1) break;
    local_8 = local_8 + sVar1;
    local_10 = local_10 - sVar1;
  }
  return;
}

Assistant:

static void
errmsg(const char *m)
{
	size_t s = strlen(m);
	ssize_t written;

	while (s > 0) {
		written = write(2, m, strlen(m));
		if (written <= 0)
			return;
		m += written;
		s -= written;
	}
}